

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sSpecialFloatTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Stress::anon_unknown_0::TextureSamplerCase::deinit(TextureSamplerCase *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  RenderCase::deinit(&this->super_RenderCase);
  if (this->m_textureID != 0) {
    iVar1 = (*((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
              [3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x480))(1,&this->m_textureID);
    this->m_textureID = 0;
  }
  return;
}

Assistant:

void TextureSamplerCase::deinit (void)
{
	RenderCase::deinit();

	if (m_textureID)
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		gl.deleteTextures(1, &m_textureID);
		m_textureID = 0;
	}
}